

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::ParseableFunctionInfo::Finalize(ParseableFunctionInfo *this,bool isShutdown)

{
  FunctionInfo *pFVar1;
  
  pFVar1 = (this->super_FunctionProxy).functionInfo.ptr;
  if (pFVar1 != (FunctionInfo *)0x0) {
    Utf8SourceInfo::StopTrackingDeferredFunction
              ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,pFVar1->functionId);
    return;
  }
  return;
}

Assistant:

void ParseableFunctionInfo::Finalize(bool isShutdown)
    {
        __super::Finalize(isShutdown);
        if (this->GetFunctionInfo())
        {
            // (If function info was never set, then initialization didn't finish, so there's nothing to remove from the dictionary.)
            this->GetUtf8SourceInfo()->StopTrackingDeferredFunction(this->GetLocalFunctionId());
        }
        if (!this->m_hasBeenParsed)
        {
            PERF_COUNTER_DEC(Code, DeferredFunction);
        }
    }